

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_set_key_test(void)

{
  int iVar1;
  char *pcVar2;
  char *__assertion;
  uint __line;
  undefined7 local_58;
  undefined1 uStack_51;
  undefined3 uStack_50;
  undefined5 uStack_4d;
  undefined1 local_48 [8];
  timeval __test_begin;
  char acStack_28 [8];
  char str [11];
  
  pcVar2 = local_48;
  _uStack_51 = CONCAT31(0x101289,uStack_51);
  uStack_4d = 0;
  gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
  _uStack_51 = CONCAT31(0x10128e,uStack_51);
  uStack_4d = 0;
  memleak_start();
  acStack_28[0] = 't';
  acStack_28[1] = 'e';
  acStack_28[2] = 's';
  acStack_28[3] = 't';
  acStack_28[4] = 's';
  acStack_28[5] = 't';
  acStack_28[6] = 'r';
  stack0xffffffffffffffdf = 0x676e69;
  _uStack_51 = CONCAT31(0x1012b5,uStack_51);
  uStack_4d = 0;
  btree_str_kv_set_key(&__test_begin.tv_usec,acStack_28,0xb);
  if (*(short *)__test_begin.tv_usec == 0xb00) {
    pcVar2 = (char *)&local_58;
    local_58 = (undefined7)*(undefined8 *)(__test_begin.tv_usec + 2);
    uStack_50 = (undefined3)((uint)*(undefined4 *)(__test_begin.tv_usec + 9) >> 8);
    uStack_51 = (undefined1)((ulong)*(undefined8 *)(__test_begin.tv_usec + 2) >> 0x38);
    iVar1 = strcmp(pcVar2,acStack_28);
    if (iVar1 == 0) {
      free((void *)__test_begin.tv_usec);
      memleak_end();
      pcVar2 = "%s PASSED\n";
      if (kv_set_key_test()::__test_pass != '\0') {
        pcVar2 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar2,"kv set key test");
      return;
    }
    __line = 0x37;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x37);
    __assertion = "cmp == 0";
  }
  else {
    __line = 0x30;
    _uStack_51 = CONCAT31(0x101358,uStack_51);
    uStack_4d = 0;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x30);
    __assertion = "kv_len_dec == str_len";
  }
  kv_set_key_test()::__test_pass = 1;
  *(code **)(pcVar2 + -8) = construct_key_ptr;
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,__line,"void kv_set_key_test()");
}

Assistant:

void kv_set_key_test()
{

    TEST_INIT();
    memleak_start();

    char str[] = "teststring";
    uint8_t *key = alca(uint8_t, sizeof(void *));
    size_t str_len = sizeof(str);

    // set key ptr
    btree_str_kv_set_key(key, str, str_len);
    void *kv_addr;
    memcpy(&kv_addr, key, sizeof(void *));

    // check key len
    key_len_t kv_len;
    memcpy(&kv_len, (key_len_t *)kv_addr, sizeof(key_len_t));
    key_len_t kv_len_dec = _endian_decode(kv_len);
    TEST_CHK(kv_len_dec == str_len);

    // check key size
    char *kv_str = alca(char, str_len);
    TEST_CHK(kv_str != NULL);
    memcpy(kv_str, ((char *)kv_addr) + sizeof(key_len_t), str_len);
    int cmp = strcmp(kv_str, str);
    TEST_CHK(cmp == 0);
    free(kv_addr);

    memleak_end();
    TEST_RESULT("kv set key test");
}